

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O1

ssize_t __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::read
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  undefined8 extraout_RAX;
  
  pcVar1 = this->P;
  if (((pcVar1 != (char *)0x0) &&
      ((uint)((int)pcVar1 - *(int *)&this->TextBegin) < this->TextSize - 1)) && (*pcVar1 != '\0')) {
    parseCurrentNode(this);
    return CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  return 0;
}

Assistant:

virtual bool read()
	{
		// if not end reached, parse the node
		if (P && (unsigned int)(P - TextBegin) < TextSize - 1 && *P != 0)
		{
			parseCurrentNode();
			return true;
		}

		_IRR_IMPLEMENT_MANAGED_MARSHALLING_BUGFIX;
		return false;
	}